

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O2

void Msat_ClauseCalcReason
               (Msat_Solver_t *p,Msat_Clause_t *pC,Msat_Lit_t Lit,Msat_IntVec_t *vLits_out)

{
  int *piVar1;
  ulong uVar2;
  
  Msat_IntVecClear(vLits_out);
  if ((Lit != -2) && (pC[1].Num != Lit)) {
    __assert_fail("Lit == MSAT_LIT_UNASSIGNED || Lit == pC->pData[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                  ,0x1a7,
                  "void Msat_ClauseCalcReason(Msat_Solver_t *, Msat_Clause_t *, Msat_Lit_t, Msat_IntVec_t *)"
                 );
  }
  uVar2 = (ulong)(Lit != -2);
  while( true ) {
    if ((*(uint *)&pC->field_0x4 >> 3 & 0x3fff) <= uVar2) {
      if ((*(uint *)&pC->field_0x4 & 1) == 0) {
        return;
      }
      Msat_SolverClaBumpActivity(p,pC);
      return;
    }
    piVar1 = Msat_SolverReadAssignsArray(p);
    if (((&pC[1].Num)[uVar2] ^ piVar1[(&pC[1].Num)[uVar2] >> 1]) != 1) break;
    Msat_IntVecPush(vLits_out,piVar1[(&pC[1].Num)[uVar2] >> 1]);
    uVar2 = uVar2 + 1;
  }
  __assert_fail("Msat_SolverReadAssignsArray(p)[MSAT_LIT2VAR(pC->pData[i])] == MSAT_LITNOT(pC->pData[i])"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatClause.c"
                ,0x1aa,
                "void Msat_ClauseCalcReason(Msat_Solver_t *, Msat_Clause_t *, Msat_Lit_t, Msat_IntVec_t *)"
               );
}

Assistant:

void Msat_ClauseCalcReason( Msat_Solver_t * p, Msat_Clause_t * pC, Msat_Lit_t Lit, Msat_IntVec_t * vLits_out )
{
    int i;
    // clear the reason
    Msat_IntVecClear( vLits_out );
    assert( Lit == MSAT_LIT_UNASSIGNED || Lit == pC->pData[0] );
    for ( i = (Lit != MSAT_LIT_UNASSIGNED); i < (int)pC->nSize; i++ )
    {
        assert( Msat_SolverReadAssignsArray(p)[MSAT_LIT2VAR(pC->pData[i])] == MSAT_LITNOT(pC->pData[i]) );
        Msat_IntVecPush( vLits_out, MSAT_LITNOT(pC->pData[i]) );
    }
    if ( pC->fLearned ) 
        Msat_SolverClaBumpActivity( p, pC );
}